

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

HttpRanges * __thiscall
kj::tryParseHttpRangeHeader
          (HttpRanges *__return_storage_ptr__,kj *this,ArrayPtr<const_char> value,
          uint64_t contentLength)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  kj *pkVar5;
  char *pcVar6;
  ArrayDisposer *pAVar7;
  ArrayDisposer *pAVar8;
  ArrayDisposer *pAVar9;
  ArrayDisposer *pAVar10;
  kj *p;
  Vector<kj::HttpByteRange> satisfiableRanges;
  char *local_a0;
  kj local_98 [4];
  uint local_94;
  ArrayDisposer *local_90;
  undefined1 local_88 [16];
  ArrayDisposer *local_78;
  ArrayDisposer *local_68;
  char *local_60;
  ArrayBuilder<kj::HttpByteRange> local_58;
  
  pAVar7 = (ArrayDisposer *)value.size_;
  pbVar4 = (byte *)skipSpace((char *)this);
  if ((((((*pbVar4 | 0x20) != 0x62) || ((pbVar4[1] | 0x20) != 0x79)) || ((pbVar4[2] | 0x20) != 0x74)
       ) || (((pbVar4[3] | 0x20) != 0x65 || ((pbVar4[4] | 0x20) != 0x73)))) ||
     (local_60 = value.ptr, pkVar5 = (kj *)skipSpace((char *)(pbVar4 + 5)), *pkVar5 != (kj)0x3d)) {
    __return_storage_ptr__->tag = 3;
    return __return_storage_ptr__;
  }
  local_58.ptr = (HttpByteRange *)0x0;
  local_58.pos = (HttpByteRange *)0x0;
  local_58.endPtr = (HttpByteRange *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_90 = (ArrayDisposer *)((long)&pAVar7[-1]._vptr_ArrayDisposer + 7);
  local_68 = (ArrayDisposer *)(ulong)((int)value.size_ - 1);
  bVar2 = false;
  do {
    p = pkVar5 + 1;
    local_a0 = skipSpace((char *)p);
    consumeNumber(local_98,&local_a0);
    uVar3 = local_94;
    if (local_98[0] == (kj)0x1) {
      pAVar9 = (ArrayDisposer *)(ulong)local_94;
      pcVar6 = skipSpace(local_a0);
      if (*pcVar6 != '-') goto LAB_00363267;
      local_a0 = skipSpace(pcVar6 + 1);
      consumeNumber(local_98,&local_a0);
      pkVar5 = (kj *)skipSpace(local_a0);
      pAVar8 = local_90;
      if (local_98[0] == (kj)0x1) {
        if (local_94 < uVar3) goto LAB_00363267;
        pAVar8 = (ArrayDisposer *)(ulong)local_94;
        if (pAVar7 <= (ArrayDisposer *)(ulong)local_94) {
          pAVar8 = local_68;
        }
      }
    }
    else {
LAB_00363267:
      pcVar6 = skipSpace((char *)p);
      if (*pcVar6 != '-') goto LAB_00363342;
      local_a0 = skipSpace(pcVar6 + 1);
      consumeNumber(local_98,&local_a0);
      if (local_98[0] != (kj)0x1) goto LAB_00363342;
      pAVar10 = (ArrayDisposer *)(ulong)local_94;
      pkVar5 = (kj *)skipSpace(local_a0);
      pAVar8 = local_90;
      pAVar9 = (ArrayDisposer *)0x0;
      if (pAVar10 <= pAVar7) {
        pAVar9 = (ArrayDisposer *)((long)pAVar7 - (long)pAVar10);
      }
    }
    local_88[0] = 1;
    local_88._8_8_ = pAVar9;
    local_78 = pAVar8;
    bVar1 = bVar2;
    if (((!bVar2) && (pAVar9 <= pAVar8)) &&
       ((pAVar9 != (ArrayDisposer *)0x0 || (bVar1 = true, pAVar8 != local_90)))) {
      Vector<kj::HttpByteRange>::add<kj::HttpByteRange&>
                ((Vector<kj::HttpByteRange> *)&local_58,(HttpByteRange *)(local_88 + 8));
      bVar1 = bVar2;
    }
    bVar2 = bVar1;
  } while (*pkVar5 == (kj)0x2c);
  if (pkVar5 == this + (long)local_60) {
    if (bVar1) {
      __return_storage_ptr__->tag = 2;
      goto LAB_00363348;
    }
    if (local_58.pos != local_58.ptr) {
      Vector<kj::HttpByteRange>::releaseAsArray
                ((Array<kj::HttpByteRange> *)local_88,(Vector<kj::HttpByteRange> *)&local_58);
      __return_storage_ptr__->tag = 1;
      *(undefined8 *)&__return_storage_ptr__->field_1 = local_88._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = local_88._8_8_;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x10) = local_78;
      local_88._0_8_ = (HttpByteRange *)0x0;
      local_88._8_8_ = (ArrayDisposer *)0x0;
      Array<kj::HttpByteRange>::~Array((Array<kj::HttpByteRange> *)local_88);
      goto LAB_00363348;
    }
  }
LAB_00363342:
  __return_storage_ptr__->tag = 3;
LAB_00363348:
  ArrayBuilder<kj::HttpByteRange>::dispose(&local_58);
  return __return_storage_ptr__;
}

Assistant:

HttpRanges tryParseHttpRangeHeader(kj::ArrayPtr<const char> value, uint64_t contentLength) {
  const char* p = value.begin();
  if (!consumeByteRangeUnit(p)) return HttpUnsatisfiableRange {};
  if (*(p++) != '=') return HttpUnsatisfiableRange {};

  auto fullRange = false;
  kj::Vector<HttpByteRange> satisfiableRanges;
  do {
    KJ_IF_SOME(range, consumeRangeSpec(p, contentLength)) {
      // Don't record more ranges if we've already recorded a full range
      if (!fullRange && range.start <= range.end) {
        if (range.start == 0 && range.end == contentLength - 1) {
          // A range evaluated to the full range, but still need to check rest are valid
          fullRange = true;
        } else {
          // "a valid bytes range-spec is satisfiable if it is either:
          // - an int-range with a first-pos that is less than the current length of the selected
          //   representation or
          // - a suffix-range with a non-zero suffix-length"
          satisfiableRanges.add(range);
        }
      }
    } else {
      // If we failed to parse a range, the whole range specification is invalid
      return HttpUnsatisfiableRange {};
    }
  } while (*(p++) == ',');

  if ((--p) != value.end()) return HttpUnsatisfiableRange {};
  if (fullRange) return HttpEverythingRange {};
  // "A valid ranges-specifier is "satisfiable" if it contains at least one range-spec that is
  // satisfiable"
  if (satisfiableRanges.size() == 0) return HttpUnsatisfiableRange {};
  return satisfiableRanges.releaseAsArray();
}